

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O3

ps_alignment_iter_t * ps_alignment_iter_children(ps_alignment_iter_t *itor)

{
  ps_alignment_t *ppVar1;
  ps_alignment_vector_t *ppVar2;
  ps_alignment_iter_t *ppVar3;
  
  if (itor != (ps_alignment_iter_t *)0x0) {
    if ((itor->vec == &itor->al->state) || (itor->vec->seq[itor->pos].child == -1)) {
      ppVar3 = (ps_alignment_iter_t *)0x0;
    }
    else {
      ppVar3 = (ps_alignment_iter_t *)
               __ckd_calloc__(1,0x20,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                              ,0x1f9);
      ppVar1 = itor->al;
      ppVar3->al = ppVar1;
      ppVar2 = itor->vec;
      ppVar3->pos = ppVar2->seq[itor->pos].child;
      ppVar3->parent = itor->pos;
      ppVar3->vec = &ppVar1->sseq + (ppVar2 != &ppVar1->word);
    }
    return ppVar3;
  }
  return (ps_alignment_iter_t *)0x0;
}

Assistant:

ps_alignment_iter_t *
ps_alignment_iter_children(ps_alignment_iter_t *itor)
{
    ps_alignment_iter_t *itor2;
    if (itor == NULL)
        return NULL;
    if (itor->vec == &itor->al->state)
        return NULL;
    if (itor->vec->seq[itor->pos].child == PS_ALIGNMENT_NONE)
        return NULL;
    itor2 = ckd_calloc(1, sizeof(*itor2));
    itor2->al = itor->al;
    itor2->pos = itor->vec->seq[itor->pos].child;
    /* Iterate over only parent's phones/states */
    itor2->parent = itor->pos;
    if (itor->vec == &itor->al->word)
        itor2->vec = &itor->al->sseq;
    else
        itor2->vec = &itor->al->state;
    return itor2;
}